

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O0

float snrm2(int n,float *x,int incx)

{
  float fVar1;
  double dVar2;
  float local_34;
  float local_30;
  float ssq;
  float scale;
  float norm;
  int ix;
  int i;
  float absxi;
  int incx_local;
  float *x_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    ssq = 0.0;
  }
  else if (n == 1) {
    dVar2 = std::fabs((double)(ulong)(uint)*x);
    ssq = SUB84(dVar2,0);
  }
  else {
    local_30 = 0.0;
    local_34 = 1.0;
    scale = 0.0;
    for (norm = 0.0; (int)norm < n; norm = (float)((int)norm + 1)) {
      if ((x[(int)scale] != 0.0) || (NAN(x[(int)scale]))) {
        dVar2 = std::fabs((double)(ulong)(uint)x[(int)scale]);
        fVar1 = SUB84(dVar2,0);
        if (fVar1 <= local_30) {
          local_34 = (fVar1 / local_30) * (fVar1 / local_30) + local_34;
        }
        else {
          local_34 = local_34 * (local_30 / fVar1) * (local_30 / fVar1) + 1.0;
          local_30 = fVar1;
        }
      }
      scale = (float)((int)scale + incx);
    }
    dVar2 = std::sqrt((double)(ulong)(uint)local_34);
    ssq = local_30 * SUB84(dVar2,0);
  }
  return ssq;
}

Assistant:

float snrm2 ( int n, float x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SNRM2 returns the euclidean norm of a float vector.
//
//  Discussion:
//
//     SNRM2 ( X ) = sqrt ( X' * X )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float X[*], the vector whose norm is to be computed.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, float SNRM2, the Euclidean norm of X.
//
{
  float absxi;
  int i;
  int ix;
  float norm;
  float scale;
  float ssq;

  if ( n < 1 || incx < 1 )
  {
    norm = 0.0;
  }
  else if ( n == 1 )
  {
    norm = fabs ( x[0] );
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( x[ix] != 0.0 )
      {
        absxi = fabs ( x[ix] );
        if ( scale < absxi )
        {
          ssq = 1.0 + ssq * ( scale / absxi ) * ( scale / absxi );
          scale = absxi;
        }
        else
        {
          ssq = ssq + ( absxi / scale ) * ( absxi / scale );
        }
      }
      ix = ix + incx;
    }

    norm = scale * sqrt ( ssq );
  }

  return norm;
}